

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O2

QString * includeGuard(QString *__return_storage_ptr__,QString *filename)

{
  bool bVar1;
  QChar *pQVar2;
  int i;
  ulong uVar3;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toUpper_helper(__return_storage_ptr__,filename);
  for (uVar3 = 0; uVar3 < (ulong)(__return_storage_ptr__->d).size; uVar3 = uVar3 + 1) {
    bVar1 = QChar::isLetterOrNumber((uint)(ushort)(__return_storage_ptr__->d).ptr[uVar3]);
    if (!bVar1) {
      pQVar2 = QString::data(__return_storage_ptr__);
      pQVar2[uVar3].ucs = L'_';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString includeGuard(const QString &filename)
{
    QString guard = filename.toUpper();

    for (int i = 0; i < guard.size(); ++i) {
        if (!guard.at(i).isLetterOrNumber())
            guard[i] = u'_';
    }

    return guard;
}